

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_network.cpp
# Opt level: O2

string * __thiscall
polyscope::CurveNetwork::getMaterial_abi_cxx11_(string *__return_storage_ptr__,CurveNetwork *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&(this->material).value);
  return __return_storage_ptr__;
}

Assistant:

std::string CurveNetwork::getMaterial() { return material.get(); }